

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O2

void Vec_StrPrintNum(Vec_Str_t *p,int Num)

{
  ulong uVar1;
  long lVar2;
  undefined8 uStack_30;
  char Digits [16];
  
  if (Num != 0) {
    uVar1 = (ulong)(uint)Num;
    if (Num < 0) {
      uStack_30 = 0x6cbb92;
      Vec_StrPush(p,'-');
      uVar1 = (ulong)(uint)-Num;
    }
    lVar2 = 0;
    for (; (int)uVar1 != 0; uVar1 = uVar1 / 10) {
      Digits[lVar2] = (char)(uVar1 % 10);
      lVar2 = lVar2 + 1;
    }
    for (; 0 < lVar2; lVar2 = lVar2 + -1) {
      uStack_30 = 0x6cbbc4;
      Vec_StrPush(p,Digits[lVar2 + -1] + '0');
    }
    return;
  }
  uStack_30 = 0x30;
  Vec_StrPush(p,'0');
  return;
}

Assistant:

static inline void Vec_StrPrintNum( Vec_Str_t * p, int Num )
{
    int i;
    char Digits[16];
    if ( Num == 0 )
    {
        Vec_StrPush( p, '0' );
        return;
    }
    if ( Num < 0 )
    {
        Vec_StrPush( p, '-' );
        Num = -Num;
    }
    for ( i = 0; Num; Num /= 10,  i++ )
        Digits[i] = Num % 10;
    for ( i--; i >= 0; i-- )
        Vec_StrPush( p, (char)('0' + Digits[i]) );
}